

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-message.h
# Opt level: O2

void __thiscall testing::Message::Message(Message *this,Message *msg)

{
  stringstream *this_00;
  string sStack_38;
  
  this_00 = (stringstream *)operator_new(0x188);
  std::__cxx11::stringstream::stringstream(this_00);
  (this->ss_).ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00;
  GetString_abi_cxx11_(&sStack_38,msg);
  std::operator<<((ostream *)(this_00 + 0x10),(string *)&sStack_38);
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

Message(const Message& msg) : ss_(new ::std::stringstream) {  // NOLINT
    *ss_ << msg.GetString();
  }